

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  long lVar1;
  bool bVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  stbi_uc *psVar7;
  byte *pbVar8;
  uint unaff_R13D;
  byte bVar9;
  stbi__pic_packet packets [10];
  stbi_uc local_58 [2];
  byte local_56 [38];
  
  iVar5 = stbi__pic_is4(s,anon_var_dwarf_364303);
  if (iVar5 == 0) goto LAB_001c4bd2;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c4b55:
    s->img_buffer = s->img_buffer + 0x58;
  }
  else {
    iVar5 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0x57 < iVar5) goto LAB_001c4b55;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar5);
  }
  iVar5 = stbi__get16be(s);
  if (x != (int *)0x0) {
    *x = iVar5;
  }
  iVar6 = stbi__get16be(s);
  if (y != (int *)0x0) {
    *y = iVar6;
    iVar6 = iVar5;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c4b9e:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_001c4bd2;
  }
  else {
    iVar5 = (*(s->io).eof)(s->io_user_data);
    if (iVar5 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_001c4bd2;
      goto LAB_001c4b9e;
    }
  }
  iVar5 = iVar6;
  if (x != (int *)0x0) {
    iVar5 = *x;
  }
  if (iVar5 != 0) {
    if (y != (int *)0x0) {
      iVar6 = *y;
    }
    if ((int)(0x10000000 / (long)iVar5) < iVar6) {
LAB_001c4bd2:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar5 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar5 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar5);
      goto LAB_001c4c38;
    }
  }
  s->img_buffer = s->img_buffer + 8;
LAB_001c4c38:
  bVar9 = 0;
  iVar5 = 0;
  do {
    if (iVar5 == 10) {
LAB_001c4d89:
      bVar2 = false;
    }
    else {
      pbVar8 = s->img_buffer;
      if (pbVar8 < s->img_buffer_end) {
LAB_001c4c74:
        s->img_buffer = pbVar8 + 1;
        unaff_R13D = (uint)*pbVar8;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar8 = s->img_buffer;
          goto LAB_001c4c74;
        }
        unaff_R13D = 0;
      }
      psVar7 = s->img_buffer;
      if (psVar7 < s->img_buffer_end) {
LAB_001c4cad:
        s->img_buffer = psVar7 + 1;
        sVar3 = *psVar7;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar7 = s->img_buffer;
          goto LAB_001c4cad;
        }
        sVar3 = '\0';
      }
      lVar1 = (long)iVar5 * 3;
      local_58[lVar1] = sVar3;
      psVar7 = s->img_buffer;
      if (psVar7 < s->img_buffer_end) {
LAB_001c4cf5:
        s->img_buffer = psVar7 + 1;
        sVar3 = *psVar7;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar7 = s->img_buffer;
          goto LAB_001c4cf5;
        }
        sVar3 = '\0';
      }
      local_58[lVar1 + 1] = sVar3;
      pbVar8 = s->img_buffer;
      if (pbVar8 < s->img_buffer_end) {
LAB_001c4d2f:
        s->img_buffer = pbVar8 + 1;
        bVar4 = *pbVar8;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar8 = s->img_buffer;
          goto LAB_001c4d2f;
        }
        bVar4 = 0;
      }
      iVar5 = iVar5 + 1;
      local_58[lVar1 + 2] = bVar4;
      bVar9 = bVar9 | bVar4;
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar6 = (*(s->io).eof)(s->io_user_data);
        if (iVar6 == 0) goto LAB_001c4d72;
        if (s->read_from_callbacks != 0) goto LAB_001c4d62;
LAB_001c4d79:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_001c4d89;
      }
LAB_001c4d62:
      if (s->img_buffer_end <= s->img_buffer) goto LAB_001c4d79;
LAB_001c4d72:
      bVar2 = true;
      if (local_58[lVar1] != '\b') goto LAB_001c4d79;
    }
    if (!bVar2) {
      return 0;
    }
    if (unaff_R13D == 0) {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar9 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}